

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall naive_trie::insert(naive_trie *this,char *key,size_t len,int32_t value)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_char,_naive_trie>_>,_bool> pVar2;
  char c;
  char local_a9;
  naive_trie local_a8;
  pair<char,_naive_trie> local_70;
  
  if (len == 0) {
    this->has_value = true;
    this->value = value;
  }
  else {
    local_a9 = *key;
    iVar1 = llama_vocab::std::
            _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
            ::find((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
                    *)this,&local_a9);
    if ((_Rb_tree_header *)iVar1._M_node == &(this->children)._M_t._M_impl.super__Rb_tree_header) {
      local_a8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_a8.children._M_t._M_impl.super__Rb_tree_header._M_header;
      local_a8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_a8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_a8.children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_a8.has_value = false;
      local_a8.value = 0;
      local_70.first = local_a9;
      local_a8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_a8.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      naive_trie(&local_70.second,&local_a8);
      pVar2 = std::
              _Rb_tree<char,std::pair<char_const,naive_trie>,std::_Select1st<std::pair<char_const,naive_trie>>,std::less<char>,std::allocator<std::pair<char_const,naive_trie>>>
              ::_M_emplace_unique<std::pair<char,naive_trie>>
                        ((_Rb_tree<char,std::pair<char_const,naive_trie>,std::_Select1st<std::pair<char_const,naive_trie>>,std::less<char>,std::allocator<std::pair<char_const,naive_trie>>>
                          *)this,&local_70);
      iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
      llama_vocab::std::
      _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
      ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
                   *)&local_70.second);
      llama_vocab::std::
      _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
      ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
                   *)&local_a8);
    }
    insert((naive_trie *)&iVar1._M_node[1]._M_parent,key + 1,len - 1,value);
  }
  return;
}

Assistant:

void insert(const char * key, size_t len, int32_t value = 0) {
        if (len == 0) {
            this->has_value = true;
            this->value = value;
            return;
        }
        char c = key[0];
        auto res = children.find(c);
        if (res != children.end()) {
            res->second.insert(key + 1, len - 1, value);
        } else {
            auto res = children.insert(std::make_pair(c, naive_trie()));
            res.first->second.insert(key + 1, len - 1, value);
        }
    }